

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::AssocArrayDeleteMethod::~AssocArrayDeleteMethod(AssocArrayDeleteMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

AssocArrayDeleteMethod() :
        SystemSubroutine(KnownSystemName::Delete, SubroutineKind::Function) {}